

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O1

void duckdb::ApproxCountDistinctUpdateFunction
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  byte bVar1;
  long lVar2;
  InternalException *this;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  Vector hash_vec;
  UnifiedVectorFormat hdata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  LogicalType local_180 [24];
  undefined1 *local_168;
  LogicalType local_160 [8];
  undefined1 local_158 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  long *local_100;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  long *local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70 [2];
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  if (count < 0x801) {
    duckdb::LogicalType::LogicalType(local_180,UBIGINT);
    duckdb::Vector::Vector((Vector *)&local_168,local_180,count);
    duckdb::LogicalType::~LogicalType(local_180);
    duckdb::VectorOperations::Hash(inputs,(Vector *)&local_168,count);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
    duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_100);
    duckdb::Vector::ToUnifiedFormat((ulong)&local_168,(UnifiedVectorFormat *)count);
    if (count != 0) {
      uVar3 = 0;
      do {
        uVar6 = uVar3;
        if (*local_70[0] != 0) {
          uVar6 = (ulong)*(uint *)(*local_70[0] + uVar3 * 4);
        }
        if ((local_60 == 0) ||
           ((*(ulong *)(local_60 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
          uVar6 = uVar3;
          if (*local_b8 != 0) {
            uVar6 = (ulong)*(uint *)(*local_b8 + uVar3 * 4);
          }
          uVar5 = uVar3;
          if (*local_100 != 0) {
            uVar5 = (ulong)*(uint *)(*local_100 + uVar3 * 4);
          }
          lVar2 = *(long *)(local_b0 + uVar6 * 8);
          uVar6 = *(ulong *)(local_f8 + uVar5 * 8);
          uVar5 = (ulong)((uint)uVar6 & 0x3f);
          uVar6 = uVar6 >> 6 | 0x400000000000000;
          bVar1 = *(byte *)(lVar2 + uVar5);
          bVar4 = (&DAT_0077b2a0)[((-uVar6 & uVar6) * 0x7edd5e59a4e28c2 >> 0x3a) * 8] + 1;
          if ((byte)((&DAT_0077b2a0)[((-uVar6 & uVar6) * 0x7edd5e59a4e28c2 >> 0x3a) * 8] + 1) <
              bVar1) {
            bVar4 = bVar1;
          }
          *(byte *)(lVar2 + uVar5) = bVar4;
        }
        uVar3 = uVar3 + 1;
      } while (count != uVar3);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    }
    if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
    }
    if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
    }
    duckdb::LogicalType::~LogicalType(local_160);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"ApproxCountDistinct - count must be at most vector size","");
  duckdb::InternalException::InternalException(this,(string *)&local_168);
  __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ApproxCountDistinctUpdateFunction(Vector inputs[], AggregateInputData &, idx_t input_count,
                                              Vector &state_vector, idx_t count) {
	D_ASSERT(input_count == 1);
	auto &input = inputs[0];
	UnifiedVectorFormat idata;
	input.ToUnifiedFormat(count, idata);

	if (count > STANDARD_VECTOR_SIZE) {
		throw InternalException("ApproxCountDistinct - count must be at most vector size");
	}
	Vector hash_vec(LogicalType::HASH, count);
	VectorOperations::Hash(input, hash_vec, count);

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	const auto states = UnifiedVectorFormat::GetDataNoConst<ApproxDistinctCountState *>(sdata);

	UnifiedVectorFormat hdata;
	hash_vec.ToUnifiedFormat(count, hdata);
	const auto *hashes = UnifiedVectorFormat::GetData<hash_t>(hdata);
	for (idx_t i = 0; i < count; i++) {
		if (idata.validity.RowIsValid(idata.sel->get_index(i))) {
			auto agg_state = states[sdata.sel->get_index(i)];
			const auto hash = hashes[hdata.sel->get_index(i)];
			agg_state->hll.InsertElement(hash);
		}
	}
}